

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_nls.c
# Opt level: O1

int IDAGetNonlinearSystemData
              (void *ida_mem,sunrealtype *tcur,N_Vector *yypred,N_Vector *yppred,N_Vector *yyn,
              N_Vector *ypn,N_Vector *res,sunrealtype *cj,void **user_data)

{
  int iVar1;
  
  if (ida_mem == (void *)0x0) {
    iVar1 = -0x14;
    IDAProcessError((IDAMem)0x0,-0x14,0xa9,"IDAGetNonlinearSystemData",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_nls.c"
                    ,"ida_mem = NULL illegal.");
  }
  else {
    *tcur = *(sunrealtype *)((long)ida_mem + 0x4f8);
    *yypred = *(N_Vector *)((long)ida_mem + 0x290);
    *yppred = *(N_Vector *)((long)ida_mem + 0x298);
    *yyn = *(N_Vector *)((long)ida_mem + 0x280);
    *ypn = *(N_Vector *)((long)ida_mem + 0x288);
    *res = *(N_Vector *)((long)ida_mem + 0x2b8);
    *cj = *(sunrealtype *)((long)ida_mem + 0x508);
    *user_data = *(void **)((long)ida_mem + 0x18);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int IDAGetNonlinearSystemData(void* ida_mem, sunrealtype* tcur, N_Vector* yypred,
                              N_Vector* yppred, N_Vector* yyn, N_Vector* ypn,
                              N_Vector* res, sunrealtype* cj, void** user_data)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  *tcur      = IDA_mem->ida_tn;
  *yypred    = IDA_mem->ida_yypredict;
  *yppred    = IDA_mem->ida_yppredict;
  *yyn       = IDA_mem->ida_yy;
  *ypn       = IDA_mem->ida_yp;
  *res       = IDA_mem->ida_savres;
  *cj        = IDA_mem->ida_cj;
  *user_data = IDA_mem->ida_user_data;

  return (IDA_SUCCESS);
}